

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

ostream * tchecker::clockbounds::operator<<(ostream *os,global_lu_map_t *map)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"L=",2);
  operator<<(os,map->_L);
  std::__ostream_insert<char,std::char_traits<char>>(os," U=",3);
  operator<<(os,map->_U);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  poVar1 = (ostream *)std::ostream::flush();
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::clockbounds::global_lu_map_t const & map)
{
  return os << "L=" << map.L() << " U=" << map.U() << std::endl;
}